

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

EffectAnalyzer * __thiscall wasm::Pusher::getPushableEffects(Pusher *this,LocalSet *pushable)

{
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false> _Var1;
  pair<std::__detail::_Node_iterator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false,_false>,_bool>
  pVar2;
  LocalSet *local_20;
  LocalSet *pushable_local;
  
  local_20 = pushable;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->pushableEffects)._M_h,&local_20);
  if (_Var1._M_cur == (__node_type *)0x0) {
    pVar2 = std::
            unordered_map<wasm::LocalSet*,wasm::EffectAnalyzer,std::hash<wasm::LocalSet*>,std::equal_to<wasm::LocalSet*>,std::allocator<std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>>>
            ::try_emplace<wasm::PassOptions&,wasm::Module&,wasm::LocalSet*&>
                      ((unordered_map<wasm::LocalSet*,wasm::EffectAnalyzer,std::hash<wasm::LocalSet*>,std::equal_to<wasm::LocalSet*>,std::allocator<std::pair<wasm::LocalSet*const,wasm::EffectAnalyzer>>>
                        *)&this->pushableEffects,&local_20,this->passOptions,this->module,&local_20)
    ;
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>
                   ._M_cur;
  }
  return (EffectAnalyzer *)
         ((long)&((_Var1._M_cur)->
                 super__Hash_node_value<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<wasm::LocalSet_*const,_wasm::EffectAnalyzer>_>
                 ._M_storage._M_storage + 8);
}

Assistant:

const EffectAnalyzer& getPushableEffects(LocalSet* pushable) {
    auto iter = pushableEffects.find(pushable);
    if (iter == pushableEffects.end()) {
      iter =
        pushableEffects.try_emplace(pushable, passOptions, module, pushable)
          .first;
    }
    return iter->second;
  }